

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

void __thiscall xe::xml::Tokenizer::getString(Tokenizer *this,string *dst)

{
  uchar uVar1;
  uchar *puVar2;
  int local_1c;
  int ndx;
  string *dst_local;
  Tokenizer *this_local;
  
  std::__cxx11::string::resize((ulong)dst);
  for (local_1c = 0; local_1c < this->m_curTokenLen + -2; local_1c = local_1c + 1) {
    uVar1 = de::RingBuffer<unsigned_char>::peekBack(&this->m_buf,local_1c + 1);
    puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)dst);
    *puVar2 = uVar1;
  }
  return;
}

Assistant:

void Tokenizer::getString (std::string& dst) const
{
	DE_ASSERT(m_curToken == TOKEN_STRING);
	dst.resize(m_curTokenLen-2);
	for (int ndx = 0; ndx < m_curTokenLen-2; ndx++)
		dst[ndx] = m_buf.peekBack(ndx+1);
}